

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O0

Operand * literal(Operand *__return_storage_ptr__,int i)

{
  string local_38;
  int local_14;
  Operand *pOStack_10;
  int i_local;
  
  local_14 = i;
  pOStack_10 = __return_storage_ptr__;
  std::__cxx11::to_string(&local_38,i);
  Operand::Operand(__return_storage_ptr__,literal,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

Operand literal(int i) {
	return Operand(Operand::Type::literal, std::to_string(i));
}